

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rp.cpp
# Opt level: O0

uint64_t substitution_round<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
                   (hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *Q,
                   TP_t *TP,text_t *T)

{
  cpair ab;
  cpair ab_00;
  cpair ab_01;
  cpair ab_02;
  cpair ab_03;
  cpair ab_04;
  cpair ab_05;
  cpair ab_06;
  bool bVar1;
  uint uVar2;
  cpair T_00;
  cpair cVar3;
  cpair TP_00;
  cpair By_1;
  cpair xA_1;
  ctype y;
  ctype x;
  ctype B_1;
  ctype A_1;
  cpair Xy;
  cpair xX;
  itype i_1;
  itype j_1;
  cpair By;
  cpair xA;
  ctype B;
  ctype A;
  itype i;
  itype j;
  uint64_t f_replaced;
  itype L_AB;
  itype P_AB;
  itype F_AB;
  triple_t q_el;
  cpair AB;
  undefined4 in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  uint in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffee4;
  hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *in_stack_fffffffffffffee8
  ;
  cpair in_stack_fffffffffffffef0;
  cpair in_stack_fffffffffffffef8;
  cpair local_f0;
  cpair in_stack_ffffffffffffff18;
  cpair in_stack_ffffffffffffff28;
  uint uVar4;
  uint local_c8;
  uint local_c4;
  cpair local_c0;
  pair<unsigned_int,_unsigned_int> in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uint uVar5;
  cpair local_70;
  uint local_68;
  uint local_64;
  ulong local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  triple_t local_48;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  cpair AB_00;
  
  T_00 = hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::max
                   ((hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *)
                    in_stack_ffffffffffffff18);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::push_back((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)in_stack_fffffffffffffef0,(value_type *)in_stack_fffffffffffffee8);
  AB_00 = T_00;
  local_48 = hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::operator[]
                       (in_stack_fffffffffffffee8,in_stack_fffffffffffffef0);
  local_54 = local_48.L_ab;
  local_4c = local_48.F_ab;
  local_60 = (ulong)local_48.F_ab;
  n_distinct_freqs = (local_48.F_ab != last_freq) + n_distinct_freqs;
  last_freq = local_48.F_ab;
  local_64 = local_48.P_ab;
  local_50 = local_64;
  uVar6 = local_64;
  uVar7 = local_54;
  uVar8 = local_48.F_ab;
  for (; uVar5 = local_50, local_64 < local_50 + local_54; local_64 = local_64 + 1) {
    local_68 = text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::
               operator[]((text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>
                           *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffedc);
    local_70 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                         ((skippable_text<unsigned_int,_unsigned_int> *)in_stack_fffffffffffffef8,
                          in_stack_fffffffffffffef0.second);
    bVar1 = std::operator==(&local_70,(pair<unsigned_int,_unsigned_int> *)&stack0xffffffffffffffe0);
    if (bVar1) {
      skippable_text<unsigned_int,_unsigned_int>::pair_ending_at
                ((skippable_text<unsigned_int,_unsigned_int> *)in_stack_fffffffffffffef8,
                 in_stack_fffffffffffffef0.second);
      skippable_text<unsigned_int,_unsigned_int>::next_pair
                ((skippable_text<unsigned_int,_unsigned_int> *)in_stack_fffffffffffffee8,
                 in_stack_fffffffffffffee4);
      skippable_text<unsigned_int,_unsigned_int>::replace
                ((skippable_text<unsigned_int,_unsigned_int> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48.second,in_stack_ffffffffffffff48.first);
      ab.second = in_stack_fffffffffffffee4;
      ab.first = in_stack_fffffffffffffee0;
      bVar1 = hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::contains
                        ((hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *)
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),ab);
      if ((bVar1) &&
         (bVar1 = std::operator!=((pair<unsigned_int,_unsigned_int> *)
                                  CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                  (pair<unsigned_int,_unsigned_int> *)
                                  CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)),
         bVar1)) {
        ab_00.second = in_stack_fffffffffffffee4;
        ab_00.first = in_stack_fffffffffffffee0;
        hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::decrease
                  ((hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),ab_00);
      }
      ab_01.second = in_stack_fffffffffffffee4;
      ab_01.first = in_stack_fffffffffffffee0;
      bVar1 = hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::contains
                        ((hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *)
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),ab_01);
      if ((bVar1) &&
         (bVar1 = std::operator!=((pair<unsigned_int,_unsigned_int> *)
                                  CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                  (pair<unsigned_int,_unsigned_int> *)
                                  CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)),
         bVar1)) {
        ab_02.second = in_stack_fffffffffffffee4;
        ab_02.first = in_stack_fffffffffffffee0;
        hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::decrease
                  ((hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),ab_02);
      }
    }
  }
  for (; uVar5 < local_50 + local_54; uVar5 = uVar5 + 1) {
    text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::operator[]
              ((text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffedc);
    uVar2 = skippable_text<unsigned_int,_unsigned_int>::operator[]
                      ((skippable_text<unsigned_int,_unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       in_stack_fffffffffffffedc);
    if (uVar2 == X) {
      cVar3 = skippable_text<unsigned_int,_unsigned_int>::pair_ending_at
                        ((skippable_text<unsigned_int,_unsigned_int> *)in_stack_fffffffffffffef8,
                         in_stack_fffffffffffffef0.second);
      local_c0 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                           ((skippable_text<unsigned_int,_unsigned_int> *)in_stack_fffffffffffffef8,
                            in_stack_fffffffffffffef0.second);
      local_c4 = AB_00.first;
      local_c8 = AB_00.second;
      in_stack_fffffffffffffee4 = cVar3.first;
      if (in_stack_fffffffffffffee4 == X) {
        in_stack_fffffffffffffee4 = local_c8;
      }
      in_stack_fffffffffffffee0 = local_c0.second;
      if (local_c0.second == X) {
        in_stack_fffffffffffffee0 = local_c4;
      }
      uVar2 = in_stack_fffffffffffffee0;
      uVar4 = in_stack_fffffffffffffee4;
      TP_00 = skippable_text<unsigned_int,_unsigned_int>::blank_pair
                        ((skippable_text<unsigned_int,_unsigned_int> *)
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      in_stack_fffffffffffffef8 = cVar3;
      bVar1 = std::operator==((pair<unsigned_int,_unsigned_int> *)&stack0xffffffffffffff48,
                              (pair<unsigned_int,_unsigned_int> *)&stack0xffffffffffffff20);
      cVar3 = in_stack_ffffffffffffff18;
      if (!bVar1) {
        std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int_&,_true>
                  ((pair<unsigned_int,_unsigned_int> *)&stack0xffffffffffffff28,
                   (uint *)&stack0xffffffffffffff34,&local_c4);
        cVar3 = in_stack_ffffffffffffff18;
        in_stack_fffffffffffffef8 = in_stack_ffffffffffffff28;
      }
      local_f0 = skippable_text<unsigned_int,_unsigned_int>::blank_pair
                           ((skippable_text<unsigned_int,_unsigned_int> *)
                            CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      bVar1 = std::operator==(&local_c0,&local_f0);
      in_stack_ffffffffffffff18 = local_c0;
      if (!bVar1) {
        std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int_&,_true>
                  ((pair<unsigned_int,_unsigned_int> *)&stack0xffffffffffffff18,&local_c8,
                   (uint *)&stack0xffffffffffffff30);
        in_stack_ffffffffffffff18 = cVar3;
      }
      ab_03.second = in_stack_fffffffffffffee4;
      ab_03.first = in_stack_fffffffffffffee0;
      bVar1 = hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::contains
                        ((hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *)
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),ab_03);
      if ((bVar1) &&
         (bVar1 = std::operator!=((pair<unsigned_int,_unsigned_int> *)
                                  CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                  (pair<unsigned_int,_unsigned_int> *)
                                  CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)),
         bVar1)) {
        ab_05.second = uVar4;
        ab_05.first = uVar2;
        synchro_or_remove_pair<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
                  ((hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *)
                   in_stack_fffffffffffffef8,(TP_t *)TP_00,(text_t *)in_stack_ffffffffffffff18,ab_05
                  );
      }
      ab_04.second = in_stack_fffffffffffffee4;
      ab_04.first = in_stack_fffffffffffffee0;
      in_stack_ffffffffffffff28 = in_stack_fffffffffffffef8;
      bVar1 = hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::contains
                        ((hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *)
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),ab_04);
      if ((bVar1) &&
         (bVar1 = std::operator!=((pair<unsigned_int,_unsigned_int> *)
                                  CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                  (pair<unsigned_int,_unsigned_int> *)
                                  CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)),
         bVar1)) {
        ab_06.second = uVar4;
        ab_06.first = uVar2;
        cVar3 = in_stack_ffffffffffffff28;
        synchro_or_remove_pair<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
                  ((hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *)
                   in_stack_ffffffffffffff28,(TP_t *)TP_00,(text_t *)in_stack_ffffffffffffff18,ab_06
                  );
        in_stack_fffffffffffffef0 = in_stack_ffffffffffffff28;
        in_stack_ffffffffffffff28 = cVar3;
      }
    }
  }
  synchronize<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
            ((hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *)
             CONCAT44(uVar8,uVar7),(TP_t *)CONCAT44(uVar6,in_stack_ffffffffffffffd0),(text_t *)T_00,
             AB_00);
  X = X + 1;
  return local_60;
}

Assistant:

uint64_t substitution_round(queue_t & Q, TP_t & TP, text_t & T){

	using ctype = text_t::char_type;

	//compute max
	cpair AB = Q.max();

	G.push_back(AB);

	//cout << "MAX freq = " << Q[AB].F_ab << endl;

	assert(Q.contains(AB));
	assert(Q[AB].F_ab >= Q.minimum_frequency());

	//extract P_AB and L_AB
	auto q_el = Q[AB];
	itype F_AB = q_el.F_ab;
	itype P_AB = q_el.P_ab;
	itype L_AB = q_el.L_ab;

	uint64_t f_replaced = F_AB;

	n_distinct_freqs += (F_AB != last_freq);
	last_freq = F_AB;

	for(itype j = P_AB; j<P_AB+L_AB;++j){

		itype i = TP[j];

		if(T.pair_starting_at(i) == AB){

			ctype A = AB.first;
			ctype B = AB.second;

			//the context of AB is xABy. We now extract AB's context:
			cpair xA = T.pair_ending_at(i);
			cpair By = T.next_pair(i);

			assert(xA == T.blank_pair() or xA.second == A);
			assert(By == T.blank_pair() or By.first == B);

			//note: xA and By could be blank pairs if this AB was the first/last pair in the text

			//perform replacement
			T.replace(i,X);

			assert(By == T.blank_pair() || T.pair_starting_at(i) == cpair(X,By.second));

			if(Q.contains(xA) && xA != AB){

				Q.decrease(xA);

			}

			if(Q.contains(By) && By != AB){

				Q.decrease(By);

			}

		}

	}

	/*
	 * re-scan text positions associated to AB and synchronize if needed
	 */
	for(itype j = P_AB; j<P_AB+L_AB;++j){

		itype i = TP[j];

		assert(T.pair_starting_at(i) != AB); //we replaced all ABs ...

		if(T[i] == X){

			//the context of X is xXy. We now extract X's left (x) and right (y) contexts:
			cpair xX = T.pair_ending_at(i);
			cpair Xy = T.pair_starting_at(i);

			ctype A = AB.first;
			ctype B = AB.second;

			//careful: x and y could be = X. in this case, before the replacements this xX was equal to ABAB -> a BA disappeared
			ctype x = xX.first == X ? B : xX.first;
			ctype y = Xy.second == X ? A : Xy.second;

			//these are the pairs that disappeared
			cpair xA = xX == T.blank_pair() ? xX : cpair {x,A};
			cpair By = Xy == T.blank_pair() ? Xy : cpair {B,y};

			if(Q.contains(By) && By != AB){

				synchro_or_remove_pair<queue_t>(Q, TP, T, By);

			}

			if(Q.contains(xA) && xA != AB){

				synchro_or_remove_pair<queue_t>(Q, TP, T, xA);

			}

		}

	}

	assert(Q.contains(AB));
	synchronize<queue_t>(Q, TP, T, AB); //automatically removes AB since new AB's frequency is 0
	assert(not Q.contains(AB));

	//advance next free dictionary symbol
	X++;

	//cout << " current text size = " << T.number_of_non_blank_characters() << endl << endl;

	return f_replaced;

}